

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.h
# Opt level: O3

void __thiscall sptk::reaper::LpcAnalyzer::~LpcAnalyzer(LpcAnalyzer *this)

{
  pointer pfVar1;
  
  pfVar1 = (this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->energywind_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
    return;
  }
  return;
}

Assistant:

~LpcAnalyzer(void) { }